

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O2

void logical_or_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  ulong uVar1;
  ulong uVar2;
  
  *accum = 0x7ffffffe;
  uVar1 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    logical_or_combine_accum_help(vals[uVar1],accum);
  }
  *accum_aux = 0x7ffffffe;
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    logical_or_combine_accum_help(auxs[uVar1],accum_aux);
  }
  return;
}

Assistant:

static void logical_or_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	int i;

	*accum = UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 0; i < n; ++i) {
		logical_or_combine_accum_help(vals[i], accum);
	}

	*accum_aux = UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 0; i < n; ++i) {
		logical_or_combine_accum_help(auxs[i], accum_aux);
	}
}